

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

Rgba * __thiscall ImagePalette::registerColor(ImagePalette *this,Rgba *rgba)

{
  bool bVar1;
  uint16_t uVar2;
  reference this_00;
  Rgba *pRVar3;
  value_type *slot;
  Rgba *rgba_local;
  ImagePalette *this_local;
  
  uVar2 = Rgba::cgbColor(rgba);
  this_00 = std::array<std::optional<Rgba>,_32769UL>::operator[](&this->_colors,(ulong)uVar2);
  uVar2 = Rgba::cgbColor(rgba);
  if (uVar2 == 0x8000) {
    options.hasTransparentPixels = true;
  }
  bVar1 = std::optional<Rgba>::has_value(this_00);
  if (bVar1) {
    pRVar3 = std::optional<Rgba>::operator*(this_00);
    bVar1 = operator!=(pRVar3,rgba);
    if (bVar1) {
      pRVar3 = std::optional<Rgba>::operator->(this_00);
      uVar2 = Rgba::cgbColor(pRVar3);
      if (uVar2 != 0xffff) {
        pRVar3 = std::optional<Rgba>::operator*(this_00);
        return pRVar3;
      }
      __assert_fail("slot->cgbColor() != UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x38,"registerColor");
    }
  }
  else {
    std::optional<Rgba>::emplace<Rgba_const&>(this_00,rgba);
  }
  return (Rgba *)0x0;
}

Assistant:

[[nodiscard]] Rgba const *registerColor(Rgba const &rgba) {
		decltype(_colors)::value_type &slot = _colors[rgba.cgbColor()];

		if (rgba.cgbColor() == Rgba::transparent) {
			options.hasTransparentPixels = true;
		}

		if (!slot.has_value()) {
			slot.emplace(rgba);
		} else if (*slot != rgba) {
			assert(slot->cgbColor() != UINT16_MAX);
			return &*slot;
		}
		return nullptr;
	}